

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_bit_shift(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  
  TVar1 = lj_opt_narrow_tobit(J,*J->base);
  TVar2 = lj_opt_narrow_tobit(J,J->base[1]);
  (J->fold).ins.field_0.ot = (ushort)(rd->data << 8) | 0x13;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_shift(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_opt_narrow_tobit(J, J->base[0]);
  TRef tsh = lj_opt_narrow_tobit(J, J->base[1]);
  IROp op = (IROp)rd->data;
  if (!(op < IR_BROL ? LJ_TARGET_MASKSHIFT : LJ_TARGET_MASKROT) &&
      !tref_isk(tsh))
    tsh = emitir(IRTI(IR_BAND), tsh, lj_ir_kint(J, 31));
#ifdef LJ_TARGET_UNIFYROT
  if (op == (LJ_TARGET_UNIFYROT == 1 ? IR_BROR : IR_BROL)) {
    op = LJ_TARGET_UNIFYROT == 1 ? IR_BROL : IR_BROR;
    tsh = emitir(IRTI(IR_NEG), tsh, tsh);
  }
#endif
  J->base[0] = emitir(IRTI(op), tr, tsh);
}